

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  allocator<char> local_fd;
  int local_fc;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0014f1d0;
  if (this->read_fd_ != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CHECK failed: File ",&local_fd);
    std::operator+(&local_b8,&local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_98,&local_b8,", line ");
    local_fc = 0x1a2;
    StreamableToString<int>(&local_f8,&local_fc);
    std::operator+(&local_78,&local_98,&local_f8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"read_fd_ == -1");
    DeathTestAbort(&local_38);
  }
  (this->matcher_).
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014fa00;
  pVVar1 = (this->matcher_).
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           .vtable_;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->matcher_).
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pSVar2->ref).super___atomic_base<int>._M_i == 0) {
      (*((this->matcher_).
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .vtable_)->shared_destroy)
                ((SharedPayloadBase *)
                 (this->matcher_).
                 super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 .buffer_.ptr);
      return;
    }
  }
  return;
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }